

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall FxColorCast::FxColorCast(FxColorCast *this,FxExpression *x)

{
  FxExpression::FxExpression(&this->super_FxExpression,EFX_ColorCast,&x->ScriptPosition);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxColorCast_007057e8;
  this->basex = x;
  (this->super_FxExpression).ValueType = (PType *)TypeColor;
  return;
}

Assistant:

FxColorCast::FxColorCast(FxExpression *x)
	: FxExpression(EFX_ColorCast, x->ScriptPosition)
{
	basex = x;
	ValueType = TypeColor;
}